

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

FunctionBody *
Js::ByteCodeSerializer::DeserializeFunction
          (ScriptContext *scriptContext,DeferDeserializeFunctionInfo *deferredFunction)

{
  ByteCodeCache *this;
  byte *functionBytes;
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  ByteCodeCache **ppBVar4;
  ByteCodeBufferReader *this_00;
  uchar **ppuVar5;
  Utf8SourceInfo *sourceInfo;
  NativeModule **ppNVar6;
  undefined4 *puVar7;
  HRESULT hr;
  ByteCodeBufferReader *reader;
  ByteCodeCache *cache;
  FunctionBody *deserializedFunctionBody;
  DeferDeserializeFunctionInfo *deferredFunction_local;
  ScriptContext *scriptContext_local;
  
  cache = (ByteCodeCache *)0x0;
  deserializedFunctionBody = (FunctionBody *)deferredFunction;
  deferredFunction_local = (DeferDeserializeFunctionInfo *)scriptContext;
  ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_ByteCodeCache__
                      ((WriteBarrierPtr *)&deferredFunction->m_cache);
  this = *ppBVar4;
  this_00 = ByteCodeCache::GetReader(this);
  ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                      ((WriteBarrierPtr *)
                       &(deserializedFunctionBody->super_ParseableFunctionInfo).flags);
  functionBytes = *ppuVar5;
  sourceInfo = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)deserializedFunctionBody);
  ppNVar6 = Memory::WriteBarrierPtr::operator_cast_to_NativeModule__
                      ((WriteBarrierPtr *)
                       &(deserializedFunctionBody->super_ParseableFunctionInfo).
                        paramScopeSlotArraySize);
  HVar3 = ByteCodeBufferReader::ReadFunctionBody
                    (this_00,functionBytes,(FunctionProxy **)&cache,sourceInfo,this,*ppNVar6,true,
                     false,(DeferDeserializeFunctionInfo *)deserializedFunctionBody);
  if (-1 < HVar3) {
    return (FunctionBody *)cache;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                              ,0x13e8,"(false)","false");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 0;
  Throw::InternalError();
}

Assistant:

FunctionBody* ByteCodeSerializer::DeserializeFunction(ScriptContext* scriptContext, DeferDeserializeFunctionInfo* deferredFunction)
{
    FunctionBody* deserializedFunctionBody = nullptr;
    ByteCodeCache* cache = deferredFunction->m_cache;
    ByteCodeBufferReader* reader = cache->GetReader();
    HRESULT hr = reader->ReadFunctionBody(deferredFunction->m_functionBytes, (FunctionProxy **)&deserializedFunctionBody, deferredFunction->GetUtf8SourceInfo(), cache, deferredFunction->m_nativeModule, true /* deserialize this */, false /* deserialize nested functions */, deferredFunction);
    if (FAILED(hr))
    {
        // This should never happen as the code is currently
        // structured since we validate the serialized bytecode during creation
        // of function proxies. In the future though, when we reorganize the byte
        // code file format, we could hit this error, in which case we
        // need a strategy to deal with this.
        Assert(false);
        Js::Throw::InternalError();
    }

    return deserializedFunctionBody;
}